

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall S2BooleanOperation::Impl::GetIndexCrossings(Impl *this,int region_id)

{
  S2ShapeIndex *a_index;
  S2ShapeIndex *b_index;
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference __a;
  iterator __first;
  iterator __last;
  IndexCrossing *crossing;
  iterator __end2;
  iterator __begin2;
  IndexCrossings *__range2;
  IndexCrossing local_cc;
  IndexCrossing *local_b8;
  __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
  local_b0;
  const_iterator local_a8;
  IndexCrossing *local_a0;
  __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
  local_98;
  __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
  local_90;
  const_iterator local_88;
  IndexCrossing *local_80;
  __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
  local_78;
  anon_class_8_1_8991fb9c local_70;
  EdgePairVisitor local_68;
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_1d;
  int local_1c;
  Impl *pIStack_18;
  int region_id_local;
  Impl *this_local;
  
  if (region_id != this->index_crossings_first_region_id_) {
    local_1c = region_id;
    pIStack_18 = this;
    if (this->index_crossings_first_region_id_ < 0) {
      local_31 = 0;
      if (region_id != 0) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_30,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                   ,0x776,kFatal,(ostream *)&std::cerr);
        local_31 = 1;
        poVar2 = S2LogMessage::stream(&local_30);
        poVar2 = std::operator<<(poVar2,"Check failed: (region_id) == (0) ");
        S2LogMessageVoidify::operator&(&local_1d,poVar2);
      }
      if ((local_31 & 1) != 0) {
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
      }
      a_index = this->op_->regions_[0];
      b_index = this->op_->regions_[1];
      local_70.this = this;
      std::function<bool(s2shapeutil::ShapeEdge_const&,s2shapeutil::ShapeEdge_const&,bool)>::
      function<S2BooleanOperation::Impl::GetIndexCrossings(int)::__0,void>
                ((function<bool(s2shapeutil::ShapeEdge_const&,s2shapeutil::ShapeEdge_const&,bool)> *
                 )&local_68,&local_70);
      bVar1 = s2shapeutil::VisitCrossingEdgePairs(a_index,b_index,ALL,&local_68);
      std::function<bool_(const_s2shapeutil::ShapeEdge_&,_const_s2shapeutil::ShapeEdge_&,_bool)>::
      ~function(&local_68);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
      sVar3 = std::
              vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
              ::size(&this->index_crossings_);
      if (1 < sVar3) {
        local_78._M_current =
             (IndexCrossing *)
             std::
             vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
             ::begin(&this->index_crossings_);
        local_80 = (IndexCrossing *)
                   std::
                   vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                   ::end(&this->index_crossings_);
        std::
        sort<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>>
                  (local_78,(__normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
                             )local_80);
        local_98._M_current =
             (IndexCrossing *)
             std::
             vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
             ::begin(&this->index_crossings_);
        local_a0 = (IndexCrossing *)
                   std::
                   vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                   ::end(&this->index_crossings_);
        local_90 = std::
                   unique<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>>
                             (local_98,(__normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
                                        )local_a0);
        __gnu_cxx::
        __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_const*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>
        ::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*>
                  ((__normal_iterator<S2BooleanOperation::Impl::IndexCrossing_const*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>
                    *)&local_88,&local_90);
        local_b0._M_current =
             (IndexCrossing *)
             std::
             vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
             ::end(&this->index_crossings_);
        __gnu_cxx::
        __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_const*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>
        ::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*>
                  ((__normal_iterator<S2BooleanOperation::Impl::IndexCrossing_const*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>
                    *)&local_a8,&local_b0);
        local_b8 = (IndexCrossing *)
                   std::
                   vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                   ::erase(&this->index_crossings_,local_88,local_a8);
      }
      IndexCrossing::IndexCrossing(&local_cc,kSentinel,kSentinel);
      std::
      vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
      ::push_back(&this->index_crossings_,&local_cc);
      this->index_crossings_first_region_id_ = 0;
    }
    if (local_1c != this->index_crossings_first_region_id_) {
      __end2 = std::
               vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
               ::begin(&this->index_crossings_);
      crossing = (IndexCrossing *)
                 std::
                 vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                 ::end(&this->index_crossings_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
                                         *)&crossing), bVar1) {
        __a = __gnu_cxx::
              __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
              ::operator*(&__end2);
        std::swap<s2shapeutil::ShapeEdgeId>(&__a->a,&__a->b);
        __a->field_0x10 = __a->field_0x10 & 0xfd | ((byte)__a->field_0x10 >> 1 & 1 ^ 1) << 1;
        __a->field_0x10 = __a->field_0x10 & 0xfb | ((byte)__a->field_0x10 >> 2 & 1 ^ 1) << 2;
        __gnu_cxx::
        __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
        ::operator++(&__end2);
      }
      __first = std::
                vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                ::begin(&this->index_crossings_);
      __last = std::
               vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
               ::end(&this->index_crossings_);
      std::
      sort<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>>
                ((__normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
                  )__first._M_current,
                 (__normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
                  )__last._M_current);
      this->index_crossings_first_region_id_ = local_1c;
    }
  }
  return true;
}

Assistant:

bool S2BooleanOperation::Impl::GetIndexCrossings(int region_id) {
  if (region_id == index_crossings_first_region_id_) return true;
  if (index_crossings_first_region_id_ < 0) {
    S2_DCHECK_EQ(region_id, 0);  // For efficiency, not correctness.
    if (!s2shapeutil::VisitCrossingEdgePairs(
            *op_->regions_[0], *op_->regions_[1],
            s2shapeutil::CrossingType::ALL,
            [this](const ShapeEdge& a, const ShapeEdge& b, bool is_interior) {
              // For all supported operations (union, intersection, and
              // difference), if the input edges have an interior crossing
              // then the output is guaranteed to have at least one edge.
              if (is_interior && is_boolean_output()) return false;
              return AddIndexCrossing(a, b, is_interior, &index_crossings_);
            })) {
      return false;
    }
    if (index_crossings_.size() > 1) {
      std::sort(index_crossings_.begin(), index_crossings_.end());
      index_crossings_.erase(
          std::unique(index_crossings_.begin(), index_crossings_.end()),
          index_crossings_.end());
    }
    // Add a sentinel value to simplify the loop logic.
    index_crossings_.push_back(IndexCrossing(kSentinel, kSentinel));
    index_crossings_first_region_id_ = 0;
  }
  if (region_id != index_crossings_first_region_id_) {
    for (auto& crossing : index_crossings_) {
      swap(crossing.a, crossing.b);
      // The following predicates get inverted when the edges are swapped.
      crossing.left_to_right ^= true;
      crossing.is_vertex_crossing ^= true;
    }
    std::sort(index_crossings_.begin(), index_crossings_.end());
    index_crossings_first_region_id_ = region_id;
  }
  return true;
}